

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,string *str_raw)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int *piVar8;
  size_type __new_size;
  pointer pqVar9;
  char cVar10;
  long lVar11;
  long lVar12;
  uchar uVar13;
  int iVar14;
  ulong uVar15;
  string digits;
  string bv_size;
  char *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined1 *local_70;
  int local_68;
  undefined1 local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  pcVar7 = (str_raw->_M_dataplus)._M_p;
  cVar10 = *pcVar7;
  uVar15 = 0;
  if (cVar10 != '\'') {
    uVar15 = 0;
    do {
      if (9 < (int)cVar10 - 0x30U) {
        __assert_fail("isdigit(str_raw[ind])",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x12d,
                      "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
      }
      std::__cxx11::string::push_back((char)local_50);
      pcVar7 = (str_raw->_M_dataplus)._M_p;
      cVar10 = pcVar7[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while (cVar10 != '\'');
  }
  bVar1 = pcVar7[(uVar15 & 0xffffffff) + 1];
  uVar5 = bVar1 - 0x62;
  if ((6 < uVar5) || ((0x45U >> (uVar5 & 0x1f) & 1) == 0)) {
    __assert_fail("(format == \'b\') || (format == \'h\') || (format == \'d\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x13a,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  iVar14 = (int)uVar15 + 2;
  if (iVar14 < (int)str_raw->_M_string_length) {
    do {
      std::__cxx11::string::push_back((char)&local_70);
      iVar14 = iVar14 + 1;
    } while (iVar14 < (int)str_raw->_M_string_length);
  }
  pcVar7 = local_50[0];
  piVar8 = __errno_location();
  iVar14 = *piVar8;
  *piVar8 = 0;
  __new_size = strtol(pcVar7,&local_90,10);
  if (local_90 == pcVar7) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)__new_size == __new_size) && (*piVar8 != 0x22)) {
    if (*piVar8 == 0) {
      *piVar8 = iVar14;
    }
    this->N = (int)__new_size;
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize(&this->bits,__new_size)
    ;
    pqVar9 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < *(int *)&(this->bits).
                     super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
                     .super__Vector_impl_data._M_finish - (int)pqVar9) {
      lVar11 = 0;
      do {
        pqVar9[lVar11].value = '\0';
        lVar11 = lVar11 + 1;
        pqVar9 = (this->bits).
                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar11 < *(int *)&(this->bits).
                                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (int)pqVar9);
    }
    if (bVar1 == 0x68) {
      if (-1 < (int)(local_68 - 1U)) {
        iVar14 = 0;
        uVar15 = (ulong)(local_68 - 1U);
        uVar3 = local_88;
        uVar4 = local_7c;
        do {
          local_7c = uVar4;
          local_88 = uVar3;
          bVar1 = local_70[uVar15];
          if (bVar1 < 0x61) {
            switch(bVar1) {
            case 0x30:
              local_80 = 0x30303030;
              break;
            case 0x31:
              local_80 = 0x31303030;
              break;
            case 0x32:
              local_80 = 0x30313030;
              break;
            case 0x33:
              local_80 = 0x31313030;
              break;
            case 0x34:
              local_80 = 0x30303130;
              break;
            case 0x35:
              local_80 = 0x31303130;
              break;
            case 0x36:
              local_80 = 0x30313130;
              break;
            case 0x37:
              local_80 = 0x31313130;
              break;
            case 0x38:
              local_80 = 0x30303031;
              break;
            case 0x39:
              local_80 = 0x31303031;
              break;
            default:
switchD_00187c3d_default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                            ,0x41,"std::string bsim::hex_digit_to_binary(const char)");
            }
          }
          else {
            switch(bVar1) {
            case 0x61:
              local_80 = 0x30313031;
              break;
            case 0x62:
              local_80 = 0x31313031;
              break;
            case 99:
              local_80 = 0x30303131;
              break;
            case 100:
              local_80 = 0x31303131;
              break;
            case 0x65:
              local_80 = 0x30313131;
              break;
            case 0x66:
              local_80 = 0x31313131;
              break;
            default:
              if (bVar1 == 0x78) {
                local_80 = 0x78787878;
              }
              else {
                if (bVar1 != 0x7a) goto switchD_00187c3d_default;
                local_80 = 0x7a7a7a7a;
              }
            }
          }
          local_88 = 4;
          uVar3 = local_88;
          local_7c = 0;
          uVar4 = local_7c;
          iVar6 = 0;
          lVar11 = 4;
          do {
            local_90 = (char *)&local_80;
            if (iVar6 + iVar14 < this->N) {
              bVar1 = *(byte *)((long)&local_88 + lVar11 + 7);
              if (bVar1 < 0x78) {
                if (bVar1 == 0x30) {
                  uVar13 = '\0';
                }
                else {
                  uVar13 = '\x01';
                  if (bVar1 != 0x31) {
LAB_00187e12:
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                  ,0x165,
                                  "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                                 );
                  }
                }
              }
              else if (bVar1 == 0x78) {
                uVar13 = '\x02';
              }
              else {
                if (bVar1 != 0x7a) goto LAB_00187e12;
                uVar13 = '\x03';
              }
              (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar6 + iVar14].value = uVar13;
              iVar6 = iVar6 + 1;
            }
            lVar12 = lVar11 + -1;
            bVar2 = 0 < lVar11;
            lVar11 = lVar12;
          } while (lVar12 != 0 && bVar2);
          local_7c = 0;
          local_88 = 4;
          iVar14 = iVar14 + 4;
          bVar2 = 0 < (long)uVar15;
          uVar15 = uVar15 - 1;
        } while (bVar2);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return;
    }
    goto LAB_00187e87;
  }
  std::__throw_out_of_range("stoi");
LAB_00187e87:
  __assert_fail("format == \'h\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x14e,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
}

Assistant:

quad_value_bit_vector(const std::string& str_raw) : N(0) {
      std::string bv_size = "";
      int ind = 0;
      while (str_raw[ind] != '\'') {
        assert(isdigit(str_raw[ind]));
        bv_size += str_raw[ind];
        ind++;
      }

      assert (str_raw[ind] == '\'');

      ind++;

      char format = str_raw[ind];

      assert((format == 'b') ||
             (format == 'h') ||
             (format == 'd'));

      ind++;

      std::string digits = "";
      while (ind < ((int) str_raw.size())) {
        digits += str_raw[ind];
        ind++;
      }

      int num_bits = stoi(bv_size);
      N = num_bits;
      //bits.resize(NUM_BYTES(num_bits));
      bits.resize(num_bits);
      for (int i = 0; i < ((int) bits.size()); i++) {
        bits[i] = 0;
      }

      // TODO: Check that digits are not too long

      assert(format == 'h');

      int bit_ind = 0;
      for (int i = digits.size() - 1; i >= 0; i--) {
        char hex_digit = digits[i];
        std::string hex_to_binary = hex_digit_to_binary(hex_digit);

        assert(hex_to_binary.size() == 4);

        int k = 0;
        for (int j = hex_to_binary.size() - 1; j >= 0; j--) {
          // Dont add past the end
          if ((bit_ind + k) < bitLength()) {
            //std::cout << "setting digit = " << hex_to_binary[j] << std::endl;
            if (hex_to_binary[j] == '1') {
              set(bit_ind + k, quad_value(1));
            } else if (hex_to_binary[j] == '0') {
              set(bit_ind + k, quad_value(0));
            } else if (hex_to_binary[j] == 'x') {
              set(bit_ind + k, quad_value(QBV_UNKNOWN_VALUE));
            } else if (hex_to_binary[j] == 'z') {
              set(bit_ind + k, quad_value(QBV_HIGH_IMPEDANCE_VALUE));
            } else {
              assert(false);
            }
            k++;
          } else {
            //assert(hex_to_binary[j] == '0');
          }
        }
        bit_ind += 4;
      }

    }